

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorProperty
          (FBXConverter *this,PropertyTable *props,string *colorName,bool *result,bool useTemplate)

{
  PropertyTable *this_00;
  Property *pPVar1;
  long lVar2;
  undefined7 in_register_00000081;
  char in_R9B;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  aiColor3D aVar8;
  
  *(undefined1 *)CONCAT71(in_register_00000081,useTemplate) = 1;
  pPVar1 = PropertyTable::Get((PropertyTable *)colorName,(string *)result);
  if (pPVar1 == (Property *)0x0) {
    if (in_R9B != '\0') {
      this_00 = (PropertyTable *)colorName[3]._M_dataplus._M_p;
      if (this_00 == (PropertyTable *)0x0) {
        bVar3 = false;
        pPVar1 = (Property *)0x0;
      }
      else {
        pPVar1 = PropertyTable::Get(this_00,(string *)result);
        bVar3 = pPVar1 != (Property *)0x0;
      }
      if (bVar3) goto LAB_00573f69;
    }
    uVar5 = 0;
    uVar7 = 0;
    bVar3 = false;
  }
  else {
LAB_00573f69:
    bVar3 = false;
    lVar2 = __dynamic_cast(pPVar1,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,0)
    ;
    if (lVar2 == 0) {
      uVar5 = 0;
      uVar7 = 0;
    }
    else {
      uVar5 = *(undefined8 *)(lVar2 + 8);
      uVar7 = *(undefined4 *)(lVar2 + 0x10);
      bVar3 = true;
    }
  }
  if (bVar3) {
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    uVar4 = CONCAT44(uVar6,uVar6);
  }
  else {
    *(undefined1 *)CONCAT71(in_register_00000081,useTemplate) = 0;
    uVar5 = 0;
    uVar4 = 0;
    uVar7 = 0;
  }
  aVar8.b = (ai_real)uVar5;
  this->defaultMaterialIndex = (uint)aVar8.b;
  *(int *)&this->field_0x4 = (int)uVar4;
  *(undefined4 *)
   &(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_start = uVar7;
  aVar8.r = (ai_real)(int)uVar4;
  aVar8.g = (ai_real)(int)((ulong)uVar4 >> 0x20);
  return aVar8;
}

Assistant:

aiColor3D FBXConverter::GetColorProperty(const PropertyTable& props, const std::string& colorName,
            bool& result, bool useTemplate)
        {
            result = true;
            bool ok;
            const aiVector3D& ColorVec = PropertyGet<aiVector3D>(props, colorName, ok, useTemplate);
            if (!ok) {
                result = false;
                return aiColor3D(0.0f, 0.0f, 0.0f);
            }
            return aiColor3D(ColorVec.x, ColorVec.y, ColorVec.z);
        }